

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void alphargbblend_generic
               (uint coverage,QRgba64 *dest,int x,QRgba64 *srcLinear,QRgba64 *src,
               QColorTrcLut *colorProfile)

{
  QRgba64 *dst;
  ulong uVar1;
  _Head_base<0UL,_unsigned_short_*,_false> _Var2;
  unsigned_short *puVar3;
  short sVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [12];
  undefined1 auVar18 [14];
  undefined1 auVar19 [12];
  undefined1 auVar20 [14];
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  unkbyte10 Var27;
  unkbyte10 Var28;
  ulong uVar29;
  quint64 qVar30;
  QRgba64 srcLinear_00;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar46;
  uint uVar62;
  uint uVar65;
  undefined1 in_XMM2 [16];
  undefined1 auVar47 [16];
  ushort uVar63;
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  ushort uVar64;
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 uVar59;
  undefined1 uVar60;
  undefined1 uVar61;
  undefined1 auVar73 [16];
  
  if (coverage != 0xff000000) {
    if (coverage == 0xffffffff) {
      uVar29 = src->rgba;
      sVar4 = (short)(uVar29 >> 0x30);
      if (sVar4 == -1) {
        dest[x].rgba = uVar29;
      }
      else if (uVar29 >> 0x30 != 0) {
        uVar1 = dest[x].rgba;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar1;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar29;
        auVar47 = pshuflw(in_XMM2,auVar36,0xff);
        auVar66._8_4_ = 0xffffffff;
        auVar66._0_8_ = 0xffffffffffffffff;
        auVar66._12_4_ = 0xffffffff;
        auVar66 = auVar66 ^ auVar47;
        uVar63 = auVar66._6_2_ * (short)(uVar1 >> 0x30);
        auVar49._0_12_ = ZEXT212(uVar63) << 0x30;
        auVar47 = pmulhuw(auVar66,auVar31);
        auVar49._12_2_ = uVar63;
        auVar49._14_2_ = auVar47._6_2_;
        auVar48._12_4_ = auVar49._12_4_;
        auVar48._0_10_ = (unkuint10)uVar63 << 0x30;
        auVar48._10_2_ = auVar47._4_2_;
        Var27 = CONCAT64(auVar48._10_6_,CONCAT22(auVar66._4_2_ * (short)(uVar1 >> 0x20),uVar63));
        auVar17._4_8_ = (long)((unkuint10)Var27 >> 0x10);
        auVar17._2_2_ = auVar47._2_2_;
        auVar17._0_2_ = auVar66._2_2_ * (short)(uVar1 >> 0x10);
        auVar5._10_2_ = 0;
        auVar5._0_10_ = auVar47._0_10_;
        auVar5._12_2_ = auVar47._6_2_;
        auVar9._8_2_ = auVar47._4_2_;
        auVar9._0_8_ = auVar47._0_8_;
        auVar9._10_4_ = auVar5._10_4_;
        auVar18._6_8_ = 0;
        auVar18._0_6_ = auVar9._8_6_;
        auVar13._4_2_ = auVar47._2_2_;
        auVar13._0_4_ = auVar47._0_4_;
        auVar13._6_8_ = SUB148(auVar18 << 0x40,6);
        auVar67._0_4_ =
             (int)((auVar47._0_4_ & 0xffff) + CONCAT22(auVar47._0_2_,auVar66._0_2_ * (short)uVar1) +
                  0x8000) >> 0x10;
        auVar67._4_4_ = auVar13._4_4_ + auVar17._0_4_ + 0x8000 >> 0x10;
        auVar67._8_4_ = auVar9._8_4_ + (int)((unkuint10)Var27 >> 0x10) + 0x8000 >> 0x10;
        auVar67._12_4_ = (int)((auVar5._10_4_ >> 0x10) + auVar48._12_4_ + 0x8000) >> 0x10;
        auVar47 = packssdw(auVar67,auVar67);
        dest[x].rgba = CONCAT26(auVar47._6_2_ + sVar4,
                                CONCAT24(auVar47._4_2_ + (short)(uVar29 >> 0x20),
                                         CONCAT22(auVar47._2_2_ + (short)(uVar29 >> 0x10),
                                                  auVar47._0_2_ + (short)uVar29)));
      }
    }
    else {
      dst = dest + x;
      srcLinear_00.rgba = dst->rgba;
      sVar4 = (short)(srcLinear_00.rgba >> 0x30);
      uVar63 = (ushort)srcLinear_00.rgba;
      uVar43 = (ushort)(srcLinear_00.rgba >> 0x10);
      uVar45 = (ushort)(srcLinear_00.rgba >> 0x20);
      if (sVar4 == -1) {
        uVar29 = src->rgba;
        if (uVar29 < 0xffff000000000000) {
          qVar30 = srcLinear_00.rgba;
          if (uVar29 >> 0x30 != 0) {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = srcLinear_00.rgba;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar29;
            auVar47 = pshuflw(in_XMM2,auVar38,0xff);
            auVar70._8_4_ = 0xffffffff;
            auVar70._0_8_ = 0xffffffffffffffff;
            auVar70._12_4_ = 0xffffffff;
            auVar70 = auVar70 ^ auVar47;
            uVar64 = -auVar70._6_2_;
            auVar53._0_12_ = ZEXT212(uVar64) << 0x30;
            auVar47 = pmulhuw(auVar70,auVar33);
            auVar53._12_2_ = uVar64;
            auVar53._14_2_ = auVar47._6_2_;
            auVar52._12_4_ = auVar53._12_4_;
            auVar52._0_10_ = (unkuint10)uVar64 << 0x30;
            auVar52._10_2_ = auVar47._4_2_;
            Var27 = CONCAT64(auVar52._10_6_,CONCAT22(auVar70._4_2_ * uVar45,uVar64));
            auVar21._4_8_ = (long)((unkuint10)Var27 >> 0x10);
            auVar21._2_2_ = auVar47._2_2_;
            auVar21._0_2_ = auVar70._2_2_ * uVar43;
            auVar7._10_2_ = 0;
            auVar7._0_10_ = auVar47._0_10_;
            auVar7._12_2_ = auVar47._6_2_;
            auVar11._8_2_ = auVar47._4_2_;
            auVar11._0_8_ = auVar47._0_8_;
            auVar11._10_4_ = auVar7._10_4_;
            auVar22._6_8_ = 0;
            auVar22._0_6_ = auVar11._8_6_;
            auVar15._4_2_ = auVar47._2_2_;
            auVar15._0_4_ = auVar47._0_4_;
            auVar15._6_8_ = SUB148(auVar22 << 0x40,6);
            auVar71._0_4_ =
                 (int)((auVar47._0_4_ & 0xffff) + CONCAT22(auVar47._0_2_,auVar70._0_2_ * uVar63) +
                      0x8000) >> 0x10;
            auVar71._4_4_ = auVar15._4_4_ + auVar21._0_4_ + 0x8000 >> 0x10;
            auVar71._8_4_ = auVar11._8_4_ + (int)((unkuint10)Var27 >> 0x10) + 0x8000 >> 0x10;
            auVar71._12_4_ = (int)((auVar7._10_4_ >> 0x10) + auVar52._12_4_ + 0x8000) >> 0x10;
            auVar47 = packssdw(auVar71,auVar71);
            qVar30 = CONCAT26(auVar47._6_2_ + (short)(uVar29 >> 0x30),
                              CONCAT24(auVar47._4_2_ + (short)(uVar29 >> 0x20),
                                       CONCAT22(auVar47._2_2_ + (short)(uVar29 >> 0x10),
                                                auVar47._0_2_ + (short)uVar29)));
          }
          if (colorProfile != (QColorTrcLut *)0x0) {
            _Var2._M_head_impl =
                 (colorProfile->m_toLinear)._M_t.
                 super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                 super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
            uVar42 = (ushort)(qVar30 >> 0x10);
            uVar44 = (ushort)(qVar30 >> 0x20);
            uVar64 = (ushort)(qVar30 >> 0x30);
            uVar64 = uVar64 - (uVar64 >> 8);
            qVar30 = CONCAT26((uVar64 >> 8) + uVar64,
                              CONCAT24((_Var2._M_head_impl[(ushort)(uVar44 - (uVar44 >> 8)) >> 4] >>
                                       8) + _Var2._M_head_impl
                                            [(ushort)(uVar44 - (uVar44 >> 8)) >> 4],
                                       CONCAT22((_Var2._M_head_impl
                                                 [(ushort)(uVar42 - (uVar42 >> 8)) >> 4] >> 8) +
                                                _Var2._M_head_impl
                                                [(ushort)(uVar42 - (uVar42 >> 8)) >> 4],
                                                (_Var2._M_head_impl
                                                 [(ushort)((ushort)qVar30 - ((ushort)qVar30 >> 8))
                                                  >> 4] >> 8) +
                                                _Var2._M_head_impl
                                                [(ushort)((ushort)qVar30 - ((ushort)qVar30 >> 8)) >>
                                                 4])));
          }
        }
        else {
          qVar30 = srcLinear->rgba;
        }
        if (colorProfile != (QColorTrcLut *)0x0) {
          _Var2._M_head_impl =
               (colorProfile->m_toLinear)._M_t.
               super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
               super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
          srcLinear_00.rgba =
               CONCAT26(0xffff,CONCAT24((_Var2._M_head_impl[(ushort)(uVar45 - (uVar45 >> 8)) >> 4]
                                        >> 8) + _Var2._M_head_impl
                                                [(ushort)(uVar45 - (uVar45 >> 8)) >> 4],
                                        CONCAT22((_Var2._M_head_impl
                                                  [(ushort)(uVar43 - (uVar43 >> 8)) >> 4] >> 8) +
                                                 _Var2._M_head_impl
                                                 [(ushort)(uVar43 - (uVar43 >> 8)) >> 4],
                                                 (_Var2._M_head_impl
                                                  [(ushort)(uVar63 - (uVar63 >> 8)) >> 4] >> 8) +
                                                 _Var2._M_head_impl
                                                 [(ushort)(uVar63 - (uVar63 >> 8)) >> 4])));
        }
        auVar34._8_8_ = 0;
        auVar34._0_8_ = srcLinear_00.rgba;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = qVar30;
        uVar61 = (undefined1)(coverage >> 0x18);
        uVar60 = (undefined1)(coverage >> 0x10);
        uVar59 = (undefined1)(coverage >> 8);
        auVar54._4_4_ =
             (int)(CONCAT35(CONCAT21(CONCAT11(uVar61,uVar61),uVar60),CONCAT14(uVar60,coverage)) >>
                  0x20);
        auVar54[3] = uVar59;
        auVar54[2] = uVar59;
        auVar54[0] = (undefined1)coverage;
        auVar54[1] = auVar54[0];
        auVar54._8_8_ = 0;
        auVar55 = pshuflw(auVar54,auVar54,0xc6);
        uVar63 = auVar55._6_2_ * (short)(qVar30 >> 0x30);
        auVar73._0_12_ = ZEXT212(uVar63) << 0x30;
        auVar47 = pmulhuw(auVar39,auVar55);
        auVar73._12_2_ = uVar63;
        auVar73._14_2_ = auVar47._6_2_;
        auVar72._12_4_ = auVar73._12_4_;
        auVar72._0_10_ = (unkuint10)uVar63 << 0x30;
        auVar72._10_2_ = auVar47._4_2_;
        Var27 = CONCAT64(auVar72._10_6_,CONCAT22(auVar55._4_2_ * (short)(qVar30 >> 0x20),uVar63));
        auVar23._4_8_ = (long)((unkuint10)Var27 >> 0x10);
        auVar23._2_2_ = auVar47._2_2_;
        auVar23._0_2_ = auVar55._2_2_ * (short)(qVar30 >> 0x10);
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar40 = auVar40 ^ auVar55;
        uVar63 = (short)(srcLinear_00.rgba >> 0x30) * auVar40._6_2_;
        auVar56._0_10_ = (unkuint10)uVar63 << 0x30;
        auVar57._0_12_ = ZEXT212(uVar63) << 0x30;
        auVar41 = pmulhuw(auVar40,auVar34);
        auVar57._12_2_ = uVar63;
        auVar57._14_2_ = auVar41._6_2_;
        auVar56._12_4_ = auVar57._12_4_;
        auVar56._10_2_ = auVar41._4_2_;
        Var28 = CONCAT64(auVar56._10_6_,
                         CONCAT22((short)(srcLinear_00.rgba >> 0x20) * auVar40._4_2_,uVar63));
        auVar24._4_8_ = (long)((unkuint10)Var28 >> 0x10);
        auVar24._2_2_ = auVar41._2_2_;
        auVar24._0_2_ = (short)(srcLinear_00.rgba >> 0x10) * auVar40._2_2_;
        uVar46 = CONCAT22(auVar41._0_2_,(short)srcLinear_00.rgba * auVar40._0_2_) +
                 CONCAT22(auVar47._0_2_,auVar55._0_2_ * (short)qVar30);
        uVar62 = auVar24._0_4_ + auVar23._0_4_;
        uVar65 = (int)((unkuint10)Var28 >> 0x10) + (int)((unkuint10)Var27 >> 0x10);
        auVar35._0_4_ = (int)((uVar46 >> 0x10) + uVar46 + 0x8000) >> 0x10;
        auVar35._4_4_ = (int)((uVar62 >> 0x10) + uVar62 + 0x8000) >> 0x10;
        auVar35._8_4_ = (int)((uVar65 >> 0x10) + uVar65 + 0x8000) >> 0x10;
        auVar35._12_4_ =
             (int)(((uint)(auVar56._12_4_ + auVar72._12_4_) >> 0x10) +
                   auVar56._12_4_ + auVar72._12_4_ + 0x8000) >> 0x10;
        auVar47 = packssdw(auVar35,auVar35);
        uVar29 = auVar47._0_8_;
        if (colorProfile != (QColorTrcLut *)0x0) {
          puVar3 = (colorProfile->m_fromLinear)._M_t.
                   super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
          uVar63 = auVar47._6_2_ - (auVar47._6_2_ >> 8);
          uVar29 = CONCAT26((uVar63 >> 8) + uVar63,
                            CONCAT24((puVar3[(ushort)(auVar47._4_2_ - (auVar47._4_2_ >> 8)) >> 4] >>
                                     8) + puVar3[(ushort)(auVar47._4_2_ - (auVar47._4_2_ >> 8)) >> 4
                                                ],
                                     CONCAT22((puVar3[(ushort)(auVar47._2_2_ - (auVar47._2_2_ >> 8))
                                                      >> 4] >> 8) +
                                              puVar3[(ushort)(auVar47._2_2_ - (auVar47._2_2_ >> 8))
                                                     >> 4],
                                              (puVar3[(ushort)(auVar47._0_2_ - (auVar47._0_2_ >> 8))
                                                      >> 4] >> 8) +
                                              puVar3[(ushort)(auVar47._0_2_ - (auVar47._0_2_ >> 8))
                                                     >> 4])));
        }
      }
      else {
        uVar46 = ((coverage & 0xff) + (coverage >> 0x10 & 0xff)) * 5 + (coverage >> 8 & 0xff) * 6 >>
                 4;
        if (uVar46 == 0) {
          return;
        }
        if (uVar46 != 0xff) {
          uVar29 = src->rgba;
          if (uVar29 < 0xffff000000000000) {
            if (uVar29 >> 0x30 != 0) {
              auVar47._8_8_ = 0;
              auVar47._0_8_ = srcLinear_00.rgba;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar29;
              auVar41 = pshuflw(in_XMM2,auVar41,0xff);
              auVar74._8_4_ = 0xffffffff;
              auVar74._0_8_ = 0xffffffffffffffff;
              auVar74._12_4_ = 0xffffffff;
              auVar74 = auVar74 ^ auVar41;
              uVar64 = auVar74._6_2_ * sVar4;
              auVar55._0_12_ = ZEXT212(uVar64) << 0x30;
              auVar47 = pmulhuw(auVar74,auVar47);
              auVar55._12_2_ = uVar64;
              auVar55._14_2_ = auVar47._6_2_;
              auVar58._12_4_ = auVar55._12_4_;
              auVar58._0_10_ = (unkuint10)uVar64 << 0x30;
              auVar58._10_2_ = auVar47._4_2_;
              Var27 = CONCAT64(auVar58._10_6_,CONCAT22(auVar74._4_2_ * uVar45,uVar64));
              auVar25._4_8_ = (long)((unkuint10)Var27 >> 0x10);
              auVar25._2_2_ = auVar47._2_2_;
              auVar25._0_2_ = auVar74._2_2_ * uVar43;
              auVar8._10_2_ = 0;
              auVar8._0_10_ = auVar47._0_10_;
              auVar8._12_2_ = auVar47._6_2_;
              auVar12._8_2_ = auVar47._4_2_;
              auVar12._0_8_ = auVar47._0_8_;
              auVar12._10_4_ = auVar8._10_4_;
              auVar26._6_8_ = 0;
              auVar26._0_6_ = auVar12._8_6_;
              auVar16._4_2_ = auVar47._2_2_;
              auVar16._0_4_ = auVar47._0_4_;
              auVar16._6_8_ = SUB148(auVar26 << 0x40,6);
              auVar75._0_4_ =
                   (int)((auVar47._0_4_ & 0xffff) + CONCAT22(auVar47._0_2_,auVar74._0_2_ * uVar63) +
                        0x8000) >> 0x10;
              auVar75._4_4_ = auVar16._4_4_ + auVar25._0_4_ + 0x8000 >> 0x10;
              auVar75._8_4_ = auVar12._8_4_ + (int)((unkuint10)Var27 >> 0x10) + 0x8000 >> 0x10;
              auVar75._12_4_ = (int)((auVar8._10_4_ >> 0x10) + auVar58._12_4_ + 0x8000) >> 0x10;
              auVar47 = packssdw(auVar75,auVar75);
              srcLinear_00.rgba =
                   CONCAT26(auVar47._6_2_ + (short)(uVar29 >> 0x30),
                            CONCAT24(auVar47._4_2_ + (short)(uVar29 >> 0x20),
                                     CONCAT22(auVar47._2_2_ + (short)(uVar29 >> 0x10),
                                              auVar47._0_2_ + (short)uVar29)));
            }
            if (colorProfile != (QColorTrcLut *)0x0) {
              _Var2._M_head_impl =
                   (colorProfile->m_toLinear)._M_t.
                   super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
              uVar43 = (ushort)(srcLinear_00.rgba >> 0x10);
              uVar45 = (ushort)(srcLinear_00.rgba >> 0x20);
              uVar63 = (ushort)(srcLinear_00.rgba >> 0x30);
              uVar63 = uVar63 - (uVar63 >> 8);
              srcLinear_00.rgba =
                   CONCAT26((uVar63 >> 8) + uVar63,
                            CONCAT24((_Var2._M_head_impl[(ushort)(uVar45 - (uVar45 >> 8)) >> 4] >> 8
                                     ) + _Var2._M_head_impl[(ushort)(uVar45 - (uVar45 >> 8)) >> 4],
                                     CONCAT22((_Var2._M_head_impl
                                               [(ushort)(uVar43 - (uVar43 >> 8)) >> 4] >> 8) +
                                              _Var2._M_head_impl
                                              [(ushort)(uVar43 - (uVar43 >> 8)) >> 4],
                                              (_Var2._M_head_impl
                                               [(ushort)((ushort)srcLinear_00.rgba -
                                                        ((ushort)srcLinear_00.rgba >> 8)) >> 4] >> 8
                                              ) + _Var2._M_head_impl
                                                  [(ushort)((ushort)srcLinear_00.rgba -
                                                           ((ushort)srcLinear_00.rgba >> 8)) >> 4]))
                           );
            }
          }
          else {
            srcLinear_00 = (QRgba64)srcLinear->rgba;
          }
          grayBlendPixel(dst,uVar46,srcLinear_00,colorProfile);
          return;
        }
        uVar29 = src->rgba;
        if (uVar29 < 0xffff000000000000) {
          if (uVar29 >> 0x30 == 0) {
            return;
          }
          auVar32._8_8_ = 0;
          auVar32._0_8_ = srcLinear_00.rgba;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar29;
          auVar47 = pshuflw(in_XMM2,auVar37,0xff);
          auVar68._8_4_ = 0xffffffff;
          auVar68._0_8_ = 0xffffffffffffffff;
          auVar68._12_4_ = 0xffffffff;
          auVar68 = auVar68 ^ auVar47;
          uVar64 = auVar68._6_2_ * sVar4;
          auVar51._0_12_ = ZEXT212(uVar64) << 0x30;
          auVar47 = pmulhuw(auVar68,auVar32);
          auVar51._12_2_ = uVar64;
          auVar51._14_2_ = auVar47._6_2_;
          auVar50._12_4_ = auVar51._12_4_;
          auVar50._0_10_ = (unkuint10)uVar64 << 0x30;
          auVar50._10_2_ = auVar47._4_2_;
          Var27 = CONCAT64(auVar50._10_6_,CONCAT22(auVar68._4_2_ * uVar45,uVar64));
          auVar19._4_8_ = (long)((unkuint10)Var27 >> 0x10);
          auVar19._2_2_ = auVar47._2_2_;
          auVar19._0_2_ = auVar68._2_2_ * uVar43;
          auVar6._10_2_ = 0;
          auVar6._0_10_ = auVar47._0_10_;
          auVar6._12_2_ = auVar47._6_2_;
          auVar10._8_2_ = auVar47._4_2_;
          auVar10._0_8_ = auVar47._0_8_;
          auVar10._10_4_ = auVar6._10_4_;
          auVar20._6_8_ = 0;
          auVar20._0_6_ = auVar10._8_6_;
          auVar14._4_2_ = auVar47._2_2_;
          auVar14._0_4_ = auVar47._0_4_;
          auVar14._6_8_ = SUB148(auVar20 << 0x40,6);
          auVar69._0_4_ =
               (int)((auVar47._0_4_ & 0xffff) + CONCAT22(auVar47._0_2_,auVar68._0_2_ * uVar63) +
                    0x8000) >> 0x10;
          auVar69._4_4_ = auVar14._4_4_ + auVar19._0_4_ + 0x8000 >> 0x10;
          auVar69._8_4_ = auVar10._8_4_ + (int)((unkuint10)Var27 >> 0x10) + 0x8000 >> 0x10;
          auVar69._12_4_ = (int)((auVar6._10_4_ >> 0x10) + auVar50._12_4_ + 0x8000) >> 0x10;
          auVar47 = packssdw(auVar69,auVar69);
          dst->rgba = CONCAT26(auVar47._6_2_ + (short)(uVar29 >> 0x30),
                               CONCAT24(auVar47._4_2_ + (short)(uVar29 >> 0x20),
                                        CONCAT22(auVar47._2_2_ + (short)(uVar29 >> 0x10),
                                                 auVar47._0_2_ + (short)uVar29)));
          return;
        }
      }
      dst->rgba = uVar29;
    }
  }
  return;
}

Assistant:

static inline void alphargbblend_generic(uint coverage, QRgba64 *dest, int x, const QRgba64 &srcLinear, const QRgba64 &src, const QColorTrcLut *colorProfile)
{
    if (coverage == 0xff000000) {
        // nothing
    } else if (coverage == 0xffffffff) {
        blend_pixel(dest[x], src);
    } else if (!dest[x].isOpaque()) {
        // Do a gray alphablend.
        alphamapblend_generic(qRgbAvg(coverage), dest, x, srcLinear, src, colorProfile);
    } else if (src.isOpaque()) {
        rgbBlendPixel(dest[x], coverage, srcLinear, colorProfile);
    } else {
        // First do naive blend with text-color
        QRgba64 s = dest[x];
        blend_pixel(s, src);
        // Then gamma-corrected blend with glyph shape
        if (colorProfile)
            s = colorProfile->toLinear(s);
        rgbBlendPixel(dest[x], coverage, s, colorProfile);
    }
}